

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::increaseIntensity_repair_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this,int beam,double intensity,int ratio)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pair<int,_int> pVar5;
  uint uVar6;
  int j;
  long lVar7;
  ulong uVar8;
  int j_1;
  long lVar9;
  int i;
  long lVar10;
  double dVar11;
  double dVar12;
  
  increaseIntensity_abi_cxx11_(__return_storage_ptr__,this,beam,intensity,ratio);
  pVar5 = getPos(this,beam);
  if (intensity <= 0.0) {
    for (lVar10 = 0; iVar3 = Collimator::getXdim(this->collimator), lVar10 < iVar3;
        lVar10 = lVar10 + 1) {
      iVar3 = Collimator::getYdim(this->collimator);
      if (pVar5.second < iVar3 / 2) {
        uVar4 = Collimator::getYdim(this->collimator);
        if ((int)uVar4 < 1) {
          uVar6 = 0;
        }
        else {
          uVar6 = 0;
          dVar11 = -1.0;
          uVar8 = (ulong)uVar4;
          do {
            dVar12 = (this->I).p[lVar10][uVar8 - 1];
            uVar4 = (uint)(uVar8 - 1);
            if (dVar12 <= dVar11) {
              dVar12 = dVar11;
              uVar4 = uVar6;
            }
            uVar6 = uVar4;
            dVar11 = dVar12;
            bVar2 = 1 < uVar8;
            uVar8 = uVar8 - 1;
          } while (bVar2);
        }
      }
      else {
        uVar6 = 0;
        dVar11 = -1.0;
        for (lVar7 = 0; iVar3 = Collimator::getYdim(this->collimator), lVar7 < iVar3;
            lVar7 = lVar7 + 1) {
          dVar12 = (this->I).p[lVar10][lVar7];
          uVar4 = (uint)lVar7;
          if (dVar12 <= dVar11) {
            dVar12 = dVar11;
            uVar4 = uVar6;
          }
          uVar6 = uVar4;
          dVar11 = dVar12;
        }
      }
      lVar7 = (long)(int)uVar6;
      while( true ) {
        lVar9 = lVar7 + 1;
        iVar3 = Collimator::getYdim(this->collimator);
        if (iVar3 <= lVar9) break;
        pdVar1 = (this->I).p[lVar10];
        dVar11 = pdVar1[lVar7];
        lVar7 = lVar9;
        if (dVar11 < pdVar1[lVar9]) {
          change_intensity(this,(int)lVar10,(int)lVar9,dVar11,__return_storage_ptr__);
        }
      }
      if (0 < (int)uVar6) {
        uVar8 = (ulong)uVar6;
        do {
          pdVar1 = (this->I).p[lVar10];
          dVar11 = pdVar1[uVar8];
          if (dVar11 < pdVar1[uVar8 - 1]) {
            change_intensity(this,(int)lVar10,(int)uVar8 + -1,dVar11,__return_storage_ptr__);
          }
          bVar2 = 1 < uVar8;
          uVar8 = uVar8 - 1;
        } while (bVar2);
      }
    }
  }
  else {
    for (lVar10 = 0; iVar3 = Collimator::getXdim(this->collimator), lVar10 < iVar3;
        lVar10 = lVar10 + 1) {
      uVar6 = 0;
      dVar11 = -1.0;
      for (lVar7 = 0; iVar3 = Collimator::getYdim(this->collimator), lVar7 < iVar3;
          lVar7 = lVar7 + 1) {
        dVar12 = (this->I).p[lVar10][lVar7];
        uVar4 = (uint)lVar7;
        if (dVar12 <= dVar11) {
          dVar12 = dVar11;
          uVar4 = uVar6;
        }
        uVar6 = uVar4;
        dVar11 = dVar12;
      }
      if (1 < (int)uVar6) {
        uVar8 = 1;
        do {
          pdVar1 = (this->I).p[lVar10];
          dVar11 = pdVar1[uVar8 - 1];
          pdVar1 = pdVar1 + uVar8;
          if (*pdVar1 <= dVar11 && dVar11 != *pdVar1) {
            change_intensity(this,(int)lVar10,(int)uVar8,dVar11,__return_storage_ptr__);
          }
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
      }
      iVar3 = Collimator::getYdim(this->collimator);
      if ((int)uVar6 < iVar3 + -2) {
        lVar7 = (long)(iVar3 + -2);
        do {
          pdVar1 = (this->I).p[lVar10];
          dVar11 = pdVar1[lVar7 + 1];
          pdVar1 = pdVar1 + lVar7;
          if (*pdVar1 <= dVar11 && dVar11 != *pdVar1) {
            change_intensity(this,(int)lVar10,(int)lVar7,dVar11,__return_storage_ptr__);
          }
          lVar7 = lVar7 + -1;
        } while ((int)uVar6 < lVar7);
      }
    }
  }
  while ((ulong)(long)this->max_apertures <
         (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    reduce_apertures(this,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

list< pair< int, double > > Station::increaseIntensity_repair(int beam, double intensity, int ratio){
    list< pair< int, double > > diff=increaseIntensity(beam, intensity, ratio);

    pair<int,int> p = getPos(beam);
    int x=p.first, y=p.second;

    if(intensity > 0.0) //reparation (phase 1A)

    for(int i=0; i<collimator.getXdim(); i++){
      int max_j=0; double max_value=-1;
      for(int j=0; j<collimator.getYdim(); j++)
         if(I(i,j)>max_value) {max_j=j; max_value=I(i,j);}

      for(int j=1; j<max_j; j++)
        if(I(i,j) < I(i,j-1))
            change_intensity(i, j, I(i,j-1), &diff);

      for(int j=collimator.getYdim()-2; j>max_j; j--)
        if(I(i,j) < I(i,j+1))
             change_intensity(i, j, I(i,j+1), &diff);
    }

    else //reparation (phase 1B)

    for(int i=0; i<collimator.getXdim(); i++){
      int max_j=0; double max_value=-1;

      if(y<collimator.getYdim()/2){
        for(int j=collimator.getYdim()-1; j>=0; j--)
          if(I(i,j)>max_value) {max_j=j; max_value=I(i,j);}
      }else{
        for(int j=0; j<collimator.getYdim(); j++)
          if(I(i,j)>max_value) {max_j=j; max_value=I(i,j);}
      }

      for(int j=max_j+1; j<collimator.getYdim(); j++)
        if(I(i,j) > I(i,j-1))
             change_intensity(i, j, I(i,j-1), &diff);

      for(int j=max_j-1; j>=0; j--)
        if(I(i,j) > I(i,j+1))
              change_intensity(i, j, I(i,j+1), &diff);
    }

    //reparation (phase 2)
    while(int2nb.size()>max_apertures)
    	reduce_apertures(diff);


    return diff;
  }